

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

void Ssw_SmlInitialize(Ssw_Sml_t *p,int fInit)

{
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar1;
  Aig_Man_t *pAVar2;
  int iVar3;
  
  if (fInit == 0) {
    for (iVar3 = 0; p_00 = p->pAig->vCis, iVar3 < p_00->nSize; iVar3 = iVar3 + 1) {
      pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar3);
      Ssw_SmlAssignRandom(p,pAVar1);
    }
  }
  else {
    pAVar2 = p->pAig;
    if (pAVar2->nRegs < 1) {
      __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                    ,0x385,"void Ssw_SmlInitialize(Ssw_Sml_t *, int)");
    }
    if (pAVar2->nObjs[2] < pAVar2->nRegs) {
      __assert_fail("Aig_ManRegNum(p->pAig) <= Aig_ManCiNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                    ,0x386,"void Ssw_SmlInitialize(Ssw_Sml_t *, int)");
    }
    for (iVar3 = 0; iVar3 < pAVar2->nTruePis; iVar3 = iVar3 + 1) {
      pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(pAVar2->vCis,iVar3);
      Ssw_SmlAssignRandom(p,pAVar1);
      pAVar2 = p->pAig;
    }
    for (iVar3 = 0; iVar3 < pAVar2->nRegs; iVar3 = iVar3 + 1) {
      pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(pAVar2->vCis,pAVar2->nTruePis + iVar3);
      Ssw_SmlObjAssignConst(p,pAVar1,0,0);
      pAVar2 = p->pAig;
    }
  }
  return;
}

Assistant:

void Ssw_SmlInitialize( Ssw_Sml_t * p, int fInit )
{
    Aig_Obj_t * pObj;
    int i;
    if ( fInit )
    {
        assert( Aig_ManRegNum(p->pAig) > 0 );
        assert( Aig_ManRegNum(p->pAig) <= Aig_ManCiNum(p->pAig) );
        // assign random info for primary inputs
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_SmlAssignRandom( p, pObj );
        // assign the initial state for the latches
        Saig_ManForEachLo( p->pAig, pObj, i )
            Ssw_SmlObjAssignConst( p, pObj, 0, 0 );
    }
    else
    {
        Aig_ManForEachCi( p->pAig, pObj, i )
            Ssw_SmlAssignRandom( p, pObj );
    }
}